

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::formatValue<char[12]>
               (ostream *out,char *param_2,char *fmtEnd,int ntrunc,char (*value) [12])

{
  int in_ECX;
  long in_RDX;
  ostream *in_RDI;
  char (*in_R8) [12];
  bool canConvertToVoidPtr;
  bool canConvertToChar;
  char (*in_stack_ffffffffffffffc8) [12];
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar2 = 0;
  uVar1 = 1;
  detail::spaceFillIfNotFinite<char[12]>(in_RDI,in_R8);
  if (*(char *)(in_RDX + -1) == 'p') {
    detail::formatValueAsType<char[12],_const_void_*,_true>::invoke
              ((ostream *)
               CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffd4,
                                                      in_stack_ffffffffffffffd0))),
               in_stack_ffffffffffffffc8);
  }
  else if (in_ECX < 0) {
    std::operator<<(in_RDI,*in_R8);
  }
  else {
    detail::formatTruncated
              ((ostream *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),*in_R8,
               CONCAT13(uVar2,CONCAT12(uVar1,in_stack_ffffffffffffffd4)));
  }
  return;
}

Assistant:

inline void formatValue(std::ostream& out, const char* /*fmtBegin*/,
                        const char* fmtEnd, int ntrunc, const T& value)
{
#ifndef TINYFORMAT_ALLOW_WCHAR_STRINGS
    // Since we don't support printing of wchar_t using "%ls", make it fail at
    // compile time in preference to printing as a void* at runtime.
    typedef typename detail::is_wchar<T>::tinyformat_wchar_is_not_supported DummyType;
    (void) DummyType(); // avoid unused type warning with gcc-4.8
#endif
    // The mess here is to support the %c and %p conversions: if these
    // conversions are active we try to convert the type to a char or const
    // void* respectively and format that instead of the value itself.  For the
    // %p conversion it's important to avoid dereferencing the pointer, which
    // could otherwise lead to a crash when printing a dangling (const char*).
    const bool canConvertToChar = detail::is_convertible<T,char>::value;
    const bool canConvertToVoidPtr = detail::is_convertible<T, const void*>::value;
    detail::spaceFillIfNotFinite(out, value);
    if (canConvertToChar && *(fmtEnd-1) == 'c')
        detail::formatValueAsType<T, char>::invoke(out, value);
    else if (canConvertToVoidPtr && *(fmtEnd-1) == 'p')
        detail::formatValueAsType<T, const void*>::invoke(out, value);
#ifdef TINYFORMAT_OLD_LIBSTDCPLUSPLUS_WORKAROUND
    else if (detail::formatZeroIntegerWorkaround<T>::invoke(out, value)) /**/;
#endif
    else if (ntrunc >= 0) {
        // Take care not to overread C strings in truncating conversions like
        // "%.4s" where at most 4 characters may be read.
        detail::formatTruncated(out, value, ntrunc);
    }
    else
        out << value;
}